

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O2

void __thiscall sjtu::exception::exception(exception *this)

{
  allocator local_1a;
  allocator local_19;
  
  this->_vptr_exception = (_func_int **)&PTR_what_abi_cxx11__0011d8a0;
  std::__cxx11::string::string((string *)&this->variant,"",&local_19);
  std::__cxx11::string::string((string *)&this->detail,"",&local_1a);
  return;
}

Assistant:

exception() {}